

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::SetPropertyUpdateSideEffect
          (DynamicTypeHandler *this,DynamicObject *instance,CharacterBuffer<char16_t> *propertyName,
          Var value,SideEffects possibleSideEffects)

{
  PropertyRecord *this_00;
  CharacterBuffer<char16_t> *pCVar1;
  bool bVar2;
  charcount_t cVar3;
  PropertyId propertyId;
  char16_t *pcVar4;
  GlobalObject *pGVar5;
  JavascriptLibrary *pJVar6;
  DynamicObject *pDVar7;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  Var pvStack_28;
  SideEffects possibleSideEffects_local;
  Var value_local;
  CharacterBuffer<char16_t> *propertyName_local;
  DynamicObject *instance_local;
  DynamicTypeHandler *this_local;
  
  if (possibleSideEffects != SideEffects_None) {
    scriptContext._7_1_ = possibleSideEffects;
    pvStack_28 = value;
    value_local = propertyName;
    propertyName_local = (CharacterBuffer<char16_t> *)instance;
    instance_local = (DynamicObject *)this;
    propertyRecord =
         (PropertyRecord *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    pcVar4 = JsUtil::CharacterBuffer<char16_t>::GetBuffer((CharacterBuffer<char16_t> *)value_local);
    cVar3 = JsUtil::CharacterBuffer<char16_t>::GetLength((CharacterBuffer<char16_t> *)value_local);
    bVar2 = BuiltInPropertyRecord<8>::Equals
                      ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::valueOf,pcVar4,cVar3);
    if (bVar2) {
      ScriptContextOptimizationOverrideInfo::SetSideEffects
                ((ScriptContextOptimizationOverrideInfo *)&propertyRecord[2].isNumeric,
                 scriptContext._7_1_ & SideEffects_ValueOf);
    }
    else {
      pcVar4 = JsUtil::CharacterBuffer<char16_t>::GetBuffer
                         ((CharacterBuffer<char16_t> *)value_local);
      cVar3 = JsUtil::CharacterBuffer<char16_t>::GetLength((CharacterBuffer<char16_t> *)value_local)
      ;
      bVar2 = BuiltInPropertyRecord<9>::Equals
                        ((BuiltInPropertyRecord<9> *)BuiltInPropertyRecords::toString,pcVar4,cVar3);
      if (bVar2) {
        ScriptContextOptimizationOverrideInfo::SetSideEffects
                  ((ScriptContextOptimizationOverrideInfo *)&propertyRecord[2].isNumeric,
                   scriptContext._7_1_ & SideEffects_ToString);
      }
      else {
        pcVar4 = JsUtil::CharacterBuffer<char16_t>::GetBuffer
                           ((CharacterBuffer<char16_t> *)value_local);
        cVar3 = JsUtil::CharacterBuffer<char16_t>::GetLength
                          ((CharacterBuffer<char16_t> *)value_local);
        bVar2 = BuiltInPropertyRecord<5>::Equals
                          ((BuiltInPropertyRecord<5> *)BuiltInPropertyRecords::Math,pcVar4,cVar3);
        pCVar1 = propertyName_local;
        if (bVar2) {
          pJVar6 = ScriptContext::GetLibrary((ScriptContext *)propertyRecord);
          pGVar5 = JavascriptLibrary::GetGlobalObject(pJVar6);
          if ((GlobalObject *)pCVar1 == pGVar5) {
            ScriptContextOptimizationOverrideInfo::SetSideEffects
                      ((ScriptContextOptimizationOverrideInfo *)&propertyRecord[2].isNumeric,
                       scriptContext._7_1_ & SideEffects_MathFunc);
          }
        }
        else {
          pJVar6 = ScriptContext::GetLibrary((ScriptContext *)propertyRecord);
          pDVar7 = JavascriptLibraryBase::GetMathObject(&pJVar6->super_JavascriptLibraryBase);
          this_00 = propertyRecord;
          if ((DynamicObject *)pCVar1 == pDVar7) {
            pcVar4 = JsUtil::CharacterBuffer<char16_t>::GetBuffer
                               ((CharacterBuffer<char16_t> *)value_local);
            cVar3 = JsUtil::CharacterBuffer<char16_t>::GetLength
                              ((CharacterBuffer<char16_t> *)value_local);
            ScriptContext::FindPropertyRecord((ScriptContext *)this_00,pcVar4,cVar3,&local_40);
            if (local_40 != (PropertyRecord *)0x0) {
              propertyId = PropertyRecord::GetPropertyId(local_40);
              bVar2 = IsMathLibraryId(propertyId);
              if (bVar2) {
                ScriptContextOptimizationOverrideInfo::SetSideEffects
                          ((ScriptContextOptimizationOverrideInfo *)&propertyRecord[2].isNumeric,
                           scriptContext._7_1_ & SideEffects_MathFunc);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DynamicTypeHandler::SetPropertyUpdateSideEffect(DynamicObject* instance, JsUtil::CharacterBuffer<WCHAR> const& propertyName, Var value, SideEffects possibleSideEffects)
    {
        if (possibleSideEffects)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            if (BuiltInPropertyRecords::valueOf.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ValueOf & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::toString.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ToString & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::Math.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                if (instance == scriptContext->GetLibrary()->GetGlobalObject())
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }
            else if (instance == scriptContext->GetLibrary()->GetMathObject())
            {
                PropertyRecord const* propertyRecord;
                scriptContext->FindPropertyRecord(propertyName.GetBuffer(), propertyName.GetLength(), &propertyRecord);

                if (propertyRecord && IsMathLibraryId(propertyRecord->GetPropertyId()))
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }

        }
    }